

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

Status google::protobuf::json_internal::anon_unknown_5::
       ParseMap<google::protobuf::json_internal::ParseProto2Descriptor>
                 (JsonLexer *lex,Field<google::protobuf::json_internal::ParseProto2Descriptor> field
                 ,Msg<google::protobuf::json_internal::ParseProto2Descriptor> *msg)

{
  int *piVar1;
  int iVar2;
  bool bVar3;
  char cVar4;
  bool bVar5;
  byte bVar6;
  Status SVar7;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
  aVar8;
  Descriptor *this;
  FieldDescriptor *pFVar9;
  string *psVar10;
  uintptr_t extraout_RAX;
  string *psVar11;
  undefined1 uVar12;
  Msg *in_RCX;
  char *pcVar13;
  undefined8 uVar14;
  Status *_status;
  _Variadic_union<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
  *p_Var15;
  char *in_R8;
  string_view literal;
  string_view literal_00;
  Metadata MVar16;
  string_view sVar17;
  string_view x;
  int64_t val;
  StatusOr<google::protobuf::json_internal::JsonLexer::Kind> kind;
  flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys_seen;
  pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator,_bool>
  insert_result;
  string_view *local_168;
  code *local_160;
  string_view local_158;
  _Variadic_union<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
  *local_148;
  Msg *local_140;
  string_view local_138;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
  local_128;
  _Variadic_union<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
  local_120;
  _Variadic_union<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
  local_f0;
  undefined1 local_d0 [16];
  FileDescriptor *local_c0 [3];
  anon_union_8_2_2904990b_for_scope_ local_a8;
  anon_union_8_2_3066aaf9_for_type_descriptor_ local_a0;
  string_view local_78;
  undefined1 local_68 [32];
  pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator,_bool>
  local_48;
  
  local_140 = in_RCX;
  JsonLexer::PeekKind((JsonLexer *)&local_128.status_);
  aVar8 = local_128;
  absl::lts_20240722::internal_statusor::
  StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>::~StatusOrData
            ((StatusOrData<google::protobuf::json_internal::JsonLexer::Kind> *)&local_128.status_);
  if ((aVar8 == (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                 )0x1) && (local_120._0_4_ == 6)) {
    SVar7 = JsonLexer::Expect(lex,field,4,"null");
    return (Status)SVar7.rep_;
  }
  local_68._0_8_ = 0;
  local_68._8_8_ = (char *)0x0;
  local_68._16_8_ = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>;
  JsonLexer::Expect(lex,field,1,"{");
  if ((lex->stream_).stream_ == (ZeroCopyInputStream *)0x1) {
    iVar2 = *(int *)((long)&field->field_22 + 4);
    if (iVar2 == 0) {
      JsonLocation::Invalid
                ((JsonLocation *)lex,&field[1].all_names_,0x22,"JSON content was too deeply nested")
      ;
      if ((lex->stream_).stream_ != (ZeroCopyInputStream *)0x1) goto LAB_002c0634;
    }
    else {
      *(int *)((long)&field->field_22 + 4) = iVar2 + -1;
      (lex->stream_).stream_ = (ZeroCopyInputStream *)0x1;
    }
    sVar17._M_str = "}";
    sVar17._M_len = 1;
    bVar3 = JsonLexer::Peek((JsonLexer *)field,sVar17);
    if (bVar3) {
      piVar1 = (int *)((long)&field->field_22 + 4);
      *piVar1 = *piVar1 + 1;
LAB_002c004b:
      (lex->stream_).stream_ = (ZeroCopyInputStream *)0x1;
    }
    else {
      local_148 = (_Variadic_union<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
                   *)&field[1].all_names_;
      do {
        JsonLexer::SkipToToken(lex);
        if ((lex->stream_).stream_ != (ZeroCopyInputStream *)0x1) goto LAB_002c0634;
        absl::lts_20240722::
        StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        ::StatusOr((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                    *)&local_128.status_);
        cVar4 = ZeroCopyBufferedStream::PeekChar((ZeroCopyBufferedStream *)field);
        if ((cVar4 != '\"') &&
           (cVar4 = ZeroCopyBufferedStream::PeekChar((ZeroCopyBufferedStream *)field), cVar4 != '\''
           )) {
          if (field[1].super_SymbolBase.symbol_type_ == '\x01') {
            JsonLexer::ParseBareWord
                      ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                        *)local_d0,(JsonLexer *)field);
            absl::lts_20240722::internal_statusor::
            StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
            ::operator=((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                         *)&local_128.status_,
                        (StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                         *)local_d0);
            goto LAB_002c00e1;
          }
          JsonLocation::Invalid((JsonLocation *)lex,local_148,0xc,"expected \'\"\'");
          goto LAB_002c062a;
        }
        JsonLexer::ParseUtf8
                  ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                    *)local_d0,(JsonLexer *)field);
        absl::lts_20240722::internal_statusor::
        StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        ::operator=((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                     *)&local_128.status_,
                    (StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                     *)local_d0);
LAB_002c00e1:
        absl::lts_20240722::internal_statusor::
        StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                         *)local_d0);
        (lex->stream_).stream_ = (ZeroCopyInputStream *)local_128;
        aVar8 = local_128;
        if (((ulong)local_128 & 1) == 0) {
          LOCK();
          *(int *)local_128 = *(int *)local_128 + 1;
          UNLOCK();
          aVar8.status_.rep_ = (Status)(lex->stream_).stream_;
        }
        if (aVar8 != (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                      )0x1) goto LAB_002c062a;
        uVar12 = 0xe0;
        JsonLexer::Expect(lex,field,1);
        if ((lex->stream_).stream_ != (ZeroCopyInputStream *)0x1) goto LAB_002c062a;
        if (local_128 !=
            (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
             )0x1) {
          bVar6 = absl::lts_20240722::internal_statusor::Helper::Crash(&local_128.status_);
LAB_002c065d:
          psVar11 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                              ((bool)uVar12,0xbf < bVar6,"is_repeated_ == label() == LABEL_REPEATED"
                              );
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_d0,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                     ,0xab7,*(undefined8 *)(psVar11 + 8),*(undefined8 *)psVar11);
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)local_d0);
        }
        piVar1 = (int *)((long)&(field[1].scope_.containing_oneof)->all_names_[-1].field_2 + 8);
        *piVar1 = *piVar1 + 1;
        local_d0 = (undefined1  [16])
                   MaybeOwnedString::AsView((MaybeOwnedString *)&local_120._M_first);
        local_168 = (string_view *)local_68;
        absl::lts_20240722::container_internal::
        raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::__cxx11::string>>
        ::EmplaceDecomposable::operator()
                  (&local_48,&local_168,(basic_string_view<char,_std::char_traits<char>_> *)local_d0
                   ,(basic_string_view<char,_std::char_traits<char>_> *)local_d0);
        if (local_48.second == false) {
          local_138 = MaybeOwnedString::AsView((MaybeOwnedString *)&local_120._M_first);
          local_168 = &local_138;
          local_160 = absl::lts_20240722::str_format_internal::FormatArgImpl::
                      Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
          in_R8 = (char *)0x1;
          absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
                    ((Field)local_d0,"got unexpectedly-repeated repeated map key: \'%s\'",0x30,
                     &local_168);
          JsonLocation::Invalid((JsonLocation *)lex,&local_f0,local_d0._8_8_,local_d0._0_8_);
          if ((FileDescriptor **)local_d0._0_8_ != local_c0) {
            operator_delete((void *)local_d0._0_8_,(ulong)&local_c0[0]->is_placeholder_);
          }
          goto LAB_002c04ee;
        }
        ParseProto2Descriptor::RecordAsSeen((Field)msg,local_140);
        bVar6 = *(byte *)((long)&msg->msg_ + 1);
        uVar12 = (bVar6 & 0x20) >> 5;
        if (0xbf < bVar6 != (bool)uVar12) goto LAB_002c065d;
        if ((bVar6 & 0x20) == 0) {
          MVar16 = Message::GetMetadata(local_140->msg_);
          local_d0._0_8_ =
               Reflection::MutableMessage
                         (MVar16.reflection,local_140->msg_,(FieldDescriptor *)msg,
                          (MessageFactory *)0x0);
        }
        else {
          MVar16 = Message::GetMetadata(local_140->msg_);
          local_d0._0_8_ =
               Reflection::AddMessage
                         (MVar16.reflection,local_140->msg_,(FieldDescriptor *)msg,
                          (MessageFactory *)0x0);
        }
        local_d0._8_8_ = (char *)0x1;
        local_c0[0] = (FileDescriptor *)0x0;
        local_a8 = (anon_union_8_2_2904990b_for_scope_)0x1;
        local_a0.message_type = (Descriptor *)0x0;
        this = FieldDescriptor::message_type((FieldDescriptor *)msg);
        pFVar9 = Descriptor::map_key(this);
        uVar14 = 0x18;
        pcVar13 = "unsupported map key type";
        p_Var15 = local_148;
        switch(pFVar9->type_) {
        case '\x03':
        case '\x10':
        case '\x12':
          sVar17 = MaybeOwnedString::AsView((MaybeOwnedString *)&local_120._M_first);
          cVar4 = absl::lts_20240722::numbers_internal::safe_strto64_base
                            (sVar17._M_len,sVar17._M_str,&local_168,10);
          uVar14 = 0x26;
          p_Var15 = &local_f0;
          pcVar13 = "non-number characters in quoted number";
          if (cVar4 == '\0') goto switchD_002c0300_caseD_a;
          ParseProto2Descriptor::SetInt64(pFVar9,(Msg *)local_d0,(int64_t)local_168);
          break;
        case '\x04':
        case '\x06':
          sVar17 = MaybeOwnedString::AsView((MaybeOwnedString *)&local_120._M_first);
          cVar4 = absl::lts_20240722::numbers_internal::safe_strtou64_base
                            (sVar17._M_len,sVar17._M_str,&local_168,10);
          uVar14 = 0x26;
          p_Var15 = &local_f0;
          pcVar13 = "non-number characters in quoted number";
          if (cVar4 == '\0') goto switchD_002c0300_caseD_a;
          ParseProto2Descriptor::SetUInt64(pFVar9,(Msg *)local_d0,(uint64_t)local_168);
          break;
        case '\x05':
        case '\x0f':
        case '\x11':
          sVar17 = MaybeOwnedString::AsView((MaybeOwnedString *)&local_120._M_first);
          cVar4 = absl::lts_20240722::numbers_internal::safe_strto32_base
                            (sVar17._M_len,sVar17._M_str,&local_168,10);
          uVar14 = 0x26;
          p_Var15 = &local_f0;
          pcVar13 = "non-number characters in quoted number";
          if (cVar4 == '\0') goto switchD_002c0300_caseD_a;
          ParseProto2Descriptor::SetInt32(pFVar9,(Msg *)local_d0,(uint32_t)local_168);
          break;
        case '\a':
        case '\r':
          sVar17 = MaybeOwnedString::AsView((MaybeOwnedString *)&local_120._M_first);
          cVar4 = absl::lts_20240722::numbers_internal::safe_strtou32_base
                            (sVar17._M_len,sVar17._M_str,&local_168,10);
          uVar14 = 0x26;
          p_Var15 = &local_f0;
          pcVar13 = "non-number characters in quoted number";
          if (cVar4 == '\0') goto switchD_002c0300_caseD_a;
          ParseProto2Descriptor::SetUInt32(pFVar9,(Msg *)local_d0,(uint32_t)local_168);
          break;
        case '\b':
          bVar3 = json_internal::operator==
                            ((MaybeOwnedString *)&local_120._M_first,(char (*) [5])0x344dfa);
          uVar12 = SUB81(pcVar13,0);
          if ((bVar3) ||
             (bVar5 = json_internal::operator==
                                ((MaybeOwnedString *)&local_120._M_first,(char (*) [6])"false"),
             bVar5)) {
            ParseProto2Descriptor::SetBool
                      ((ParseProto2Descriptor *)pFVar9,(Field)local_d0,(Msg *)(ulong)bVar3,
                       (bool)uVar12);
            break;
          }
          local_78 = MaybeOwnedString::AsView((MaybeOwnedString *)&local_120._M_first);
          local_138._M_str =
               (char *)absl::lts_20240722::str_format_internal::FormatArgImpl::
                       Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
          local_138._M_len = (size_t)&local_78;
          in_R8 = (char *)0x1;
          absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
                    (&local_168,"expected bool string, got \'%s\'",0x1e,&local_138);
          JsonLocation::Invalid((JsonLocation *)lex,&local_f0,local_160,local_168);
          if (local_168 != &local_158) {
            operator_delete(local_168,local_158._M_len + 1);
          }
          goto LAB_002c04cf;
        case '\t':
          psVar10 = MaybeOwnedString::ToString_abi_cxx11_((MaybeOwnedString *)&local_120._M_first);
          x._M_str = in_R8;
          x._M_len = (size_t)(psVar10->_M_dataplus)._M_p;
          ParseProto2Descriptor::SetString
                    ((ParseProto2Descriptor *)pFVar9,(Field)local_d0,
                     (Msg *)psVar10->_M_string_length,x);
          break;
        case '\n':
        case '\v':
        case '\f':
        case '\x0e':
          goto switchD_002c0300_caseD_a;
        default:
          pcVar13 = "unsupported map key type";
          goto switchD_002c0300_caseD_a;
        }
        pFVar9 = Descriptor::map_value(this);
        ParseSingular<google::protobuf::json_internal::ParseProto2Descriptor>
                  (lex,field,(Msg<google::protobuf::json_internal::ParseProto2Descriptor> *)pFVar9);
LAB_002c04cf:
        absl::lts_20240722::container_internal::
        raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<int>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
        ::~raw_hash_set((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<int>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                         *)&local_a8);
        absl::lts_20240722::container_internal::
        raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<int>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
        ::~raw_hash_set((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<int>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                         *)(local_d0 + 8));
LAB_002c04ee:
        if ((lex->stream_).stream_ != (ZeroCopyInputStream *)0x1) {
LAB_002c062a:
          absl::lts_20240722::internal_statusor::
          StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                           *)&local_128.status_);
          goto LAB_002c0634;
        }
        literal._M_str = ",";
        literal._M_len = 1;
        bVar3 = JsonLexer::Peek((JsonLexer *)field,literal);
        absl::lts_20240722::internal_statusor::
        StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                         *)&local_128.status_);
        literal_00._M_str = "}";
        literal_00._M_len = 1;
        bVar5 = JsonLexer::Peek((JsonLexer *)field,literal_00);
        if (bVar5) {
          piVar1 = (int *)((long)&field->field_22 + 4);
          *piVar1 = *piVar1 + 1;
          if ((!bVar3) || (field[1].super_SymbolBase.symbol_type_ != '\0')) goto LAB_002c004b;
          pcVar13 = "expected \'}\'";
          goto LAB_002c05fd;
        }
      } while (bVar3);
      pcVar13 = "expected \',\'";
LAB_002c05fd:
      JsonLocation::Invalid((JsonLocation *)lex,local_148,0xc,pcVar13);
    }
  }
LAB_002c0634:
  absl::lts_20240722::container_internal::
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_68);
  return (Status)extraout_RAX;
switchD_002c0300_caseD_a:
  JsonLocation::Invalid((JsonLocation *)lex,p_Var15,uVar14,pcVar13);
  goto LAB_002c04cf;
}

Assistant:

absl::Status ParseMap(JsonLexer& lex, Field<Traits> field, Msg<Traits>& msg) {
  if (lex.Peek(JsonLexer::kNull)) {
    return lex.Expect("null");
  }

  absl::flat_hash_set<std::string> keys_seen;
  return lex.VisitObject(
      [&](LocationWith<MaybeOwnedString>& key) -> absl::Status {
        lex.path().NextRepeated();
        auto insert_result = keys_seen.emplace(key.value.AsView());
        if (!insert_result.second) {
          return key.loc.Invalid(absl::StrFormat(
              "got unexpectedly-repeated repeated map key: '%s'",
              key.value.AsView()));
        }
        return Traits::NewMsg(
            field, msg,
            [&](const Desc<Traits>& type, Msg<Traits>& entry) -> absl::Status {
              auto key_field = Traits::KeyField(type);
              switch (Traits::FieldType(key_field)) {
                case FieldDescriptor::TYPE_INT64:
                case FieldDescriptor::TYPE_SINT64:
                case FieldDescriptor::TYPE_SFIXED64: {
                  int64_t n;
                  if (!absl::SimpleAtoi(key.value.AsView(), &n)) {
                    return key.loc.Invalid(
                        "non-number characters in quoted number");
                  }
                  Traits::SetInt64(key_field, entry, n);
                  break;
                }
                case FieldDescriptor::TYPE_UINT64:
                case FieldDescriptor::TYPE_FIXED64: {
                  uint64_t n;
                  if (!absl::SimpleAtoi(key.value.AsView(), &n)) {
                    return key.loc.Invalid(
                        "non-number characters in quoted number");
                  }
                  Traits::SetUInt64(key_field, entry, n);
                  break;
                }
                case FieldDescriptor::TYPE_INT32:
                case FieldDescriptor::TYPE_SINT32:
                case FieldDescriptor::TYPE_SFIXED32: {
                  int32_t n;
                  if (!absl::SimpleAtoi(key.value.AsView(), &n)) {
                    return key.loc.Invalid(
                        "non-number characters in quoted number");
                  }
                  Traits::SetInt32(key_field, entry, n);
                  break;
                }
                case FieldDescriptor::TYPE_UINT32:
                case FieldDescriptor::TYPE_FIXED32: {
                  uint32_t n;
                  if (!absl::SimpleAtoi(key.value.AsView(), &n)) {
                    return key.loc.Invalid(
                        "non-number characters in quoted number");
                  }
                  Traits::SetUInt32(key_field, entry, n);
                  break;
                }
                case FieldDescriptor::TYPE_BOOL: {
                  if (key.value == "true") {
                    Traits::SetBool(key_field, entry, true);
                  } else if (key.value == "false") {
                    Traits::SetBool(key_field, entry, false);
                  } else {
                    return key.loc.Invalid(absl::StrFormat(
                        "expected bool string, got '%s'", key.value.AsView()));
                  }
                  break;
                }
                case FieldDescriptor::TYPE_STRING: {
                  Traits::SetString(key_field, entry,
                                    std::move(key.value.ToString()));
                  break;
                }
                default:
                  return lex.Invalid("unsupported map key type");
              }

              return ParseSingular<Traits>(lex, Traits::ValueField(type),
                                           entry);
            });
      });
}